

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O2

la_proto_node *
v1v2_alo_alr_parse(uint8_t *hdrbuf,int hdrlen,uint8_t *bodybuf,int bodylen,
                  la_miam_core_pdu_type pdu_type)

{
  undefined4 uVar1;
  void *pvVar2;
  la_proto_node *plVar3;
  la_type_descriptor *plVar4;
  
  pvVar2 = la_xcalloc(1,0x70,
                      "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/miam-core.c"
                      ,0x95,"v1v2_alo_alr_parse");
  plVar3 = la_proto_node_new();
  if ((int)bodybuf == 2) {
    plVar4 = &la_DEF_miam_core_v1v2_alo_pdu;
  }
  else {
    plVar4 = &la_DEF_miam_core_v1v2_alr_pdu;
  }
  plVar3->td = plVar4;
  plVar3->data = pvVar2;
  plVar3->next = (la_proto_node *)0x0;
  if (hdrlen < 0xd) {
    *(byte *)((long)pvVar2 + 8) = *(byte *)((long)pvVar2 + 8) | 8;
  }
  else {
    *(uint *)((long)pvVar2 + 0xc) = (uint)hdrbuf[3] | (uint)hdrbuf[2] << 8 | (uint)hdrbuf[1] << 0x10
    ;
    uVar1 = *(undefined4 *)(hdrbuf + 7);
    *(undefined4 *)((long)pvVar2 + 0x14) = *(undefined4 *)(hdrbuf + 4);
    *(undefined4 *)((long)pvVar2 + 0x17) = uVar1;
    *(undefined1 *)((long)pvVar2 + 0x1b) = 0;
    *(uint8_t *)((long)pvVar2 + 0x1c) = hdrbuf[0xb];
    *(uint8_t *)((long)pvVar2 + 0x1d) = hdrbuf[0xc];
  }
  return plVar3;
}

Assistant:

static la_proto_node *v1v2_alo_alr_parse(uint8_t const *hdrbuf, int hdrlen, uint8_t const *bodybuf,
		int bodylen, la_miam_core_pdu_type pdu_type) {
	LA_UNUSED(bodybuf);
	LA_UNUSED(bodylen);

	la_assert(hdrbuf != NULL);
	la_assert(pdu_type == LA_MIAM_CORE_PDU_ALO || pdu_type == LA_MIAM_CORE_PDU_ALR);

	LA_NEW(la_miam_core_v1v2_alo_alr_pdu, pdu);
	la_proto_node *node = la_proto_node_new();
	if(pdu_type == LA_MIAM_CORE_PDU_ALO) {
		node->td = &la_DEF_miam_core_v1v2_alo_pdu;
	} else if(pdu_type == LA_MIAM_CORE_PDU_ALR) {
		node->td = &la_DEF_miam_core_v1v2_alr_pdu;
	}
	node->data = pdu;
	node->next = NULL;

	if(hdrlen < 13) {       // should be 16, but let's not be overly pedantic on unused octets
		la_debug_print(D_ERROR, "Header too short: %d < 16\n", hdrlen);
		pdu->err |= LA_MIAM_ERR_HDR_TRUNCATED;
		goto end;
	}

	pdu->pdu_len = (hdrbuf[1] << 16) | (hdrbuf[2] << 8) | hdrbuf[3];
	hdrbuf += 4; hdrlen -= 4;

	memcpy(&pdu->aircraft_id, hdrbuf, 7);
	pdu->aircraft_id[7] = '\0';
	la_debug_print(D_INFO, "len: %u aircraft_id: %s\n", pdu->pdu_len, pdu->aircraft_id);
	hdrbuf += 7; hdrlen -= 7;

	pdu->compression = hdrbuf[0];
	pdu->networks = hdrbuf[1];
	la_debug_print(D_INFO, "compression: 0x%02x networks: 0x%02x\n",
			pdu->compression, pdu->networks);
end:
	return node;
}